

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# normalizer.cc
# Opt level: O2

Status __thiscall
sentencepiece::normalizer::Normalizer::Normalize
          (Normalizer *this,string_view input,string *normalized,
          vector<unsigned_long,_std::allocator<unsigned_long>_> *norm_to_orig)

{
  char **ppcVar1;
  pointer puVar2;
  basic_string_view<char,_std::char_traits<char>_> __x;
  bool bVar3;
  byte bVar4;
  NormalizerSpec *pNVar5;
  byte bVar6;
  string *psVar7;
  uint uVar8;
  size_t n;
  ulong uVar9;
  size_t sVar10;
  Normalizer *this_00;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *in_R9;
  size_t m;
  ulong uVar11;
  char *pcVar12;
  string_view text;
  string_view text_00;
  string_view input_00;
  __type_identity_t<basic_string_view<char,_char_traits<char>_>_> __y;
  string_view input_01;
  string_view expected;
  string_view suffix;
  string_view suffix_00;
  int consumed;
  vector<unsigned_long,_std::allocator<unsigned_long>_> *norm_to_orig_local;
  char *local_228;
  string *normalized_local;
  string_view sp;
  unsigned_long local_1f0;
  string_view kSpaceSymbol;
  anon_class_40_5_a21b5dae add_ws;
  pair<std::basic_string_view<char,_std::char_traits<char>_>,_int> p;
  
  pcVar12 = input._M_str;
  this_00 = (Normalizer *)input._M_len;
  puVar2 = (in_R9->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if ((in_R9->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
      super__Vector_impl_data._M_finish != puVar2) {
    (in_R9->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
    super__Vector_impl_data._M_finish = puVar2;
  }
  (norm_to_orig->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  *(undefined1 *)
   (norm_to_orig->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
   super__Vector_impl_data._M_start = 0;
  normalized_local = (string *)norm_to_orig;
  if (pcVar12 != (char *)0x0) {
    norm_to_orig_local = in_R9;
    (*this_00->_vptr_Normalizer[3])(this,this_00);
    if (this->_vptr_Normalizer != (_func_int **)0x0) {
      return (unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
              )(unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
                )this;
    }
    util::Status::~Status((Status *)this);
    consumed = 0;
    if (this_00->spec_->remove_extra_whitespaces_ == true) {
      for (; pcVar12 != (char *)0x0; pcVar12 = pcVar12 + -(long)p.second) {
        input_00._M_str = (char *)normalized;
        input_00._M_len = (size_t)pcVar12;
        NormalizePrefix(&p,this_00,input_00);
        __x._M_len._4_4_ = p.first._M_len._4_4_;
        __x._M_len._0_4_ = (int)p.first._M_len;
        __x._M_str = p.first._M_str;
        __y._M_str = " ";
        __y._M_len = 1;
        bVar3 = std::operator!=(__x,__y);
        if (bVar3) goto LAB_00226f76;
        normalized = (string *)((long)&(normalized->_M_dataplus)._M_p + (long)p.second);
        consumed = consumed + p.second;
      }
    }
    else {
LAB_00226f76:
      local_228 = pcVar12;
      std::__cxx11::string::reserve((ulong)normalized_local);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
                (norm_to_orig_local,(long)pcVar12 * 3);
      add_ws.kSpaceSymbol = &kSpaceSymbol;
      kSpaceSymbol._M_len = 3;
      kSpaceSymbol._M_str = anon_var_dwarf_7852a;
      add_ws.consumed = &consumed;
      pNVar5 = this_00->spec_;
      add_ws.this = this_00;
      add_ws.normalized = &normalized_local;
      add_ws.norm_to_orig = &norm_to_orig_local;
      if ((this_00->treat_whitespace_as_suffix_ == false) && (pNVar5->add_dummy_prefix_ == true)) {
        Normalize::anon_class_40_5_a21b5dae::operator()(&add_ws);
        pNVar5 = this_00->spec_;
      }
      bVar6 = pNVar5->remove_extra_whitespaces_;
      pcVar12 = local_228;
      bVar4 = bVar6;
      while (pcVar12 != (char *)0x0) {
        input_01._M_str = (char *)normalized;
        input_01._M_len = (size_t)pcVar12;
        psVar7 = normalized;
        local_228 = pcVar12;
        NormalizePrefix(&p,this_00,input_01);
        sp._M_len = CONCAT44(p.first._M_len._4_4_,(int)p.first._M_len);
        sp._M_str = p.first._M_str;
        if ((bVar4 & 1) != 0) {
          do {
            expected._M_str = (char *)psVar7;
            expected._M_len = (size_t)" ";
            bVar3 = absl::ConsumePrefix((absl *)&sp,(string_view *)0x1,expected);
          } while (bVar3);
        }
        pcVar12 = sp._M_str;
        if (sp._M_len != 0) {
          for (uVar9 = 0; uVar9 < sp._M_len; uVar9 = uVar9 + 1) {
            if ((this_00->spec_->escape_whitespaces_ == true) && (pcVar12[uVar9] == ' ')) {
              std::__cxx11::string::append((char *)normalized_local,(ulong)kSpaceSymbol._M_str);
              for (uVar11 = 0; uVar11 < kSpaceSymbol._M_len; uVar11 = uVar11 + 1) {
                local_1f0 = (unsigned_long)consumed;
                std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
                emplace_back<unsigned_long>(norm_to_orig_local,&local_1f0);
              }
            }
            else {
              std::__cxx11::string::push_back((char)normalized_local);
              local_1f0 = (unsigned_long)consumed;
              std::vector<unsigned_long,_std::allocator<unsigned_long>_>::
              emplace_back<unsigned_long>(norm_to_orig_local,&local_1f0);
            }
          }
          text._M_str = sp._M_str;
          text._M_len = sp._M_len;
          suffix._M_str = " ";
          suffix._M_len = 1;
          bVar4 = absl::EndsWith(text,suffix);
        }
        consumed = consumed + p.second;
        normalized = (string *)((long)&(normalized->_M_dataplus)._M_p + (long)p.second);
        pcVar12 = local_228 + -(long)p.second;
        pNVar5 = this_00->spec_;
        bVar6 = pNVar5->remove_extra_whitespaces_;
        if ((bool)bVar6 == false) {
          bVar4 = 0;
        }
      }
      if ((bVar6 & 1) != 0) {
        sVar10 = 1;
        pcVar12 = " ";
        if (pNVar5->escape_whitespaces_ != false) {
          sVar10 = kSpaceSymbol._M_len;
          pcVar12 = kSpaceSymbol._M_str;
        }
        while (text_00._M_str = (normalized_local->_M_dataplus)._M_p,
              text_00._M_len = normalized_local->_M_string_length, suffix_00._M_str = pcVar12,
              suffix_00._M_len = sVar10, bVar3 = absl::EndsWith(text_00,suffix_00), bVar3) {
          uVar8 = (int)normalized_local->_M_string_length - (int)sVar10;
          if ((int)uVar8 < 0) {
            ppcVar1 = &p.first._M_str;
            p.first._M_len._0_4_ = 0xd;
            std::__cxx11::ostringstream::ostringstream((ostringstream *)ppcVar1);
            std::operator<<((ostream *)ppcVar1,"third_party/sentencepiece/src/normalizer.cc");
            std::operator<<((ostream *)ppcVar1,"(");
            std::ostream::operator<<(ppcVar1,0xab);
            std::operator<<((ostream *)ppcVar1,") [");
            std::operator<<((ostream *)ppcVar1,"(length) >= (0)");
            std::operator<<((ostream *)ppcVar1,"] ");
            util::StatusBuilder::operator_cast_to_Status((StatusBuilder *)this);
            goto LAB_00227363;
          }
          uVar9 = (ulong)(uVar8 & 0x7fffffff);
          consumed = (int)(norm_to_orig_local->
                          super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl
                          .super__Vector_impl_data._M_start[uVar9];
          std::__cxx11::string::resize((ulong)normalized_local);
          std::vector<unsigned_long,_std::allocator<unsigned_long>_>::resize
                    (norm_to_orig_local,uVar9);
        }
      }
      if ((this_00->treat_whitespace_as_suffix_ == true) &&
         (this_00->spec_->add_dummy_prefix_ == true)) {
        Normalize::anon_class_40_5_a21b5dae::operator()(&add_ws);
      }
      p.first._M_len._0_4_ = consumed;
      p.first._M_len._4_4_ = consumed >> 0x1f;
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
                (norm_to_orig_local,(unsigned_long *)&p);
      if ((long)(norm_to_orig_local->
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                super__Vector_impl_data._M_finish -
          (long)(norm_to_orig_local->
                super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
                super__Vector_impl_data._M_start >> 3 != normalized_local->_M_string_length + 1) {
        ppcVar1 = &p.first._M_str;
        p.first._M_len._0_4_ = 0xd;
        std::__cxx11::ostringstream::ostringstream((ostringstream *)ppcVar1);
        std::operator<<((ostream *)ppcVar1,"third_party/sentencepiece/src/normalizer.cc");
        std::operator<<((ostream *)ppcVar1,"(");
        std::ostream::operator<<(ppcVar1,0xb7);
        std::operator<<((ostream *)ppcVar1,") [");
        std::operator<<((ostream *)ppcVar1,"(norm_to_orig->size()) == (normalized->size() + 1)");
        std::operator<<((ostream *)ppcVar1,"] ");
        util::StatusBuilder::operator_cast_to_Status((StatusBuilder *)this);
LAB_00227363:
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)&p.first._M_str);
        return (unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
                )(unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
                  )this;
      }
    }
  }
  util::Status::Status((Status *)this);
  return (unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
          )(unique_ptr<sentencepiece::util::Status::Rep,_std::default_delete<sentencepiece::util::Status::Rep>_>
            )this;
}

Assistant:

util::Status Normalizer::Normalize(absl::string_view input,
                                   std::string *normalized,
                                   std::vector<size_t> *norm_to_orig) const {
  norm_to_orig->clear();
  normalized->clear();

  if (input.empty()) {
    return util::OkStatus();
  }

  RETURN_IF_ERROR(status());

  int consumed = 0;

  // Ignores heading space.
  if (spec_->remove_extra_whitespaces()) {
    while (!input.empty()) {
      const auto p = NormalizePrefix(input);
      if (p.first != " ") {
        break;
      }
      input.remove_prefix(p.second);
      consumed += p.second;
    }
  }

  // all chars are whitespace.
  if (input.empty()) {
    return util::OkStatus();
  }

  // Reserves the output buffer to avoid re-allocations.
  const size_t kReservedSize = input.size() * 3;
  normalized->reserve(kReservedSize);
  norm_to_orig->reserve(kReservedSize);

  // Replaces white space with U+2581 (LOWER ONE EIGHT BLOCK)
  // if escape_whitespaces() is set (default = true).
  const absl::string_view kSpaceSymbol = "\xe2\x96\x81";

  // adds kSpaceSymbol to the current context.
  auto add_ws = [this, &consumed, &normalized, &norm_to_orig, &kSpaceSymbol]() {
    if (spec_->escape_whitespaces()) {
      normalized->append(kSpaceSymbol.data(), kSpaceSymbol.size());
      for (size_t n = 0; n < kSpaceSymbol.size(); ++n) {
        norm_to_orig->push_back(consumed);
      }
    } else {
      normalized->append(" ");
      norm_to_orig->push_back(consumed);
    }
  };

  // Adds a space symbol as a prefix (default is true)
  // With this prefix, "world" and "hello world" are converted into
  // "_world" and "_hello_world", which help the trainer to extract
  // "_world" as one symbol.
  if (!treat_whitespace_as_suffix_ && spec_->add_dummy_prefix()) add_ws();

  bool is_prev_space = spec_->remove_extra_whitespaces();
  while (!input.empty()) {
    auto p = NormalizePrefix(input);
    absl::string_view sp = p.first;

    // Removes heading spaces in sentence piece,
    // if the previous sentence piece ends with whitespace.
    while (is_prev_space && absl::ConsumePrefix(&sp, " ")) {
    }

    if (!sp.empty()) {
      const char *data = sp.data();
      for (size_t n = 0; n < sp.size(); ++n) {
        if (spec_->escape_whitespaces() && data[n] == ' ') {
          // replace ' ' with kSpaceSymbol.
          normalized->append(kSpaceSymbol.data(), kSpaceSymbol.size());
          for (size_t m = 0; m < kSpaceSymbol.size(); ++m) {
            norm_to_orig->push_back(consumed);
          }
        } else {
          *normalized += data[n];
          norm_to_orig->push_back(consumed);
        }
      }
      // Checks whether the last character of sp is whitespace.
      is_prev_space = absl::EndsWith(sp, " ");
    }

    consumed += p.second;
    input.remove_prefix(p.second);
    if (!spec_->remove_extra_whitespaces()) {
      is_prev_space = false;
    }
  }

  // Ignores trailing space.
  if (spec_->remove_extra_whitespaces()) {
    const absl::string_view space =
        spec_->escape_whitespaces() ? kSpaceSymbol : " ";
    while (absl::EndsWith(*normalized, space)) {
      const int length = normalized->size() - space.size();
      CHECK_GE_OR_RETURN(length, 0);
      consumed = (*norm_to_orig)[length];
      normalized->resize(length);
      norm_to_orig->resize(length);
    }
  }

  // Adds a space symbol as a suffix (default is false)
  if (treat_whitespace_as_suffix_ && spec_->add_dummy_prefix()) add_ws();

  norm_to_orig->push_back(consumed);

  CHECK_EQ_OR_RETURN(norm_to_orig->size(), normalized->size() + 1);

  return util::OkStatus();
}